

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exttpose.cc
# Opt level: O2

void __thiscall Exttpose::do_invert_db(Exttpose *this,int pblk,int mincustid,int maxcustid)

{
  pointer pTVar1;
  int __fd;
  ostream *poVar2;
  unsigned_long uVar3;
  ulong uVar4;
  ExttposeArgument *pEVar5;
  runtime_error *this_00;
  int use_seq;
  undefined4 in_register_0000000c;
  int *piVar6;
  int iVar7;
  long lVar8;
  ulong uVar9;
  undefined4 in_register_00000034;
  int pos;
  long lVar10;
  long lVar11;
  DbaseCtrlBlk *pDVar12;
  bool bVar13;
  int custid;
  int tid;
  int numitem;
  int local_22c;
  int *buf;
  int local_21c;
  ulong local_218;
  int local_20c;
  int local_208;
  int local_204;
  undefined8 local_200;
  DbaseCtrlBlk *local_1f8;
  undefined8 local_1f0;
  undefined1 *local_1e8;
  undefined8 local_1e0;
  undefined1 local_1d8 [16];
  string tmpnam;
  ostringstream tmpname;
  string local_1a0 [368];
  
  local_1f0 = CONCAT44(in_register_00000034,pblk);
  local_200 = CONCAT44(in_register_0000000c,maxcustid);
  numitem = 0;
  tid = 0;
  custid = 0;
  buf = (int *)0x0;
  local_208 = mincustid;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&tmpname);
  pDVar12 = &this->dcb;
  DbaseCtrlBlk::get_first_blk(pDVar12);
  DbaseCtrlBlk::get_next_trans(pDVar12,&buf,&numitem,&tid,&custid);
  local_20c = (int)local_200 + 1;
  pos = 0;
  local_1f8 = pDVar12;
  do {
    pDVar12 = local_1f8;
    if (this->args->num_partitions <= pos) {
      poVar2 = std::operator<<((ostream *)&this->env->logger,"WROTE INVERT ");
      std::endl<char,std::char_traits<char>>(poVar2);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&tmpname);
      return;
    }
    std::operator<<((ostream *)&tmpname,(string *)&this->args->output);
    if (1 < this->args->num_partitions) {
      poVar2 = std::operator<<((ostream *)&tmpname,".P");
      std::ostream::operator<<(poVar2,pos);
    }
    std::__cxx11::stringbuf::str();
    local_1e8 = local_1d8;
    local_1e0 = 0;
    local_1d8[0] = 0;
    std::__cxx11::stringbuf::str(local_1a0);
    std::__cxx11::string::~string((string *)&local_1e8);
    __fd = open(tmpnam._M_dataplus._M_p,0x241,0x1b6);
    if (__fd < 0) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"Can\'t open out file");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    uVar3 = this->numfreq;
    piVar6 = &((this->extary).super__Vector_base<TransArray,_std::allocator<TransArray>_>._M_impl.
               super__Vector_impl_data._M_start)->theSize;
    while (bVar13 = uVar3 != 0, uVar3 = uVar3 - 1, bVar13) {
      *(undefined8 *)(piVar6 + -1) = 0;
      *(char *)(piVar6 + -2) = '\0';
      piVar6 = piVar6 + 0x12;
    }
    iVar7 = pos * (int)local_1f0 + local_208;
    local_22c = (int)local_1f0 + iVar7;
    if ((int)local_200 <= local_22c) {
      local_22c = local_20c;
    }
    poVar2 = std::operator<<((ostream *)&this->env->logger,"BOUNDS ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar7);
    poVar2 = std::operator<<(poVar2," ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_22c);
    std::endl<char,std::char_traits<char>>(poVar2);
    local_21c = __fd;
    while (((this->dcb).readall != '\x01' && (local_204 = custid, custid < local_22c))) {
      local_218 = 0;
      while ((this->dcb).readall != '\x01') {
        pEVar5 = this->args;
        if ((local_204 != custid) || (local_22c <= custid)) goto LAB_00108969;
        if (pEVar5->use_diff == '\0') {
          for (lVar8 = 0; lVar8 < numitem; lVar8 = lVar8 + 1) {
            iVar7 = (this->freqidx).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[buf[lVar8]];
            lVar10 = (long)iVar7;
            if (lVar10 != -1) {
              pEVar5 = this->args;
              if (pEVar5->use_newformat == '\0') {
                use_seq = pEVar5->use_seq;
                pTVar1 = (this->extary).super__Vector_base<TransArray,_std::allocator<TransArray>_>.
                         _M_impl.super__Vector_impl_data._M_start;
                if ((use_seq != 0) && (pTVar1[lVar10].theFlg == '\0')) {
                  (this->fidx).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[(int)local_218] = iVar7;
                  pTVar1[lVar10].theFlg = '\x01';
                  TransArray::add(pTVar1 + lVar10,__fd,tid,pEVar5->use_seq,pos,custid);
                  local_218 = (ulong)((int)local_218 + 1);
                  goto LAB_00108921;
                }
                iVar7 = -1;
              }
              else {
                pTVar1 = (this->extary).super__Vector_base<TransArray,_std::allocator<TransArray>_>.
                         _M_impl.super__Vector_impl_data._M_start;
                use_seq = pEVar5->use_seq;
                iVar7 = custid;
              }
              TransArray::add(pTVar1 + lVar10,__fd,tid,use_seq,pos,iVar7);
            }
LAB_00108921:
          }
        }
        else {
          iVar7 = 0;
          for (lVar8 = 0; lVar8 < numitem; lVar8 = lVar8 + 1) {
            uVar4 = (ulong)buf[lVar8];
            if ((this->freqidx).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[uVar4] != -1) {
              lVar10 = (long)iVar7;
              lVar11 = lVar10 * 0x48;
              for (; iVar7 = iVar7 + 1, __fd = local_21c,
                  (this->backidx).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar10] < (int)uVar4; lVar10 = lVar10 + 1) {
                TransArray::add((TransArray *)
                                ((long)&(((this->extary).
                                          super__Vector_base<TransArray,_std::allocator<TransArray>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->theArray).
                                        super__Vector_base<int,_std::allocator<int>_>._M_impl +
                                lVar11),local_21c,tid,this->args->use_seq,pos,
                                -(uint)(this->args->use_newformat == '\0') | custid);
                uVar4 = (ulong)(uint)buf[lVar8];
                lVar11 = lVar11 + 0x48;
              }
            }
          }
          uVar4 = (ulong)iVar7;
          lVar8 = uVar4 * 0x48;
          for (; pDVar12 = local_1f8, uVar4 < this->numfreq; uVar4 = uVar4 + 1) {
            TransArray::add((TransArray *)
                            ((long)&(((this->extary).
                                      super__Vector_base<TransArray,_std::allocator<TransArray>_>.
                                      _M_impl.super__Vector_impl_data._M_start)->theArray).
                                    super__Vector_base<int,_std::allocator<int>_>._M_impl + lVar8),
                            __fd,tid,this->args->use_seq,pos,
                            -(uint)(this->args->use_newformat == '\0') | custid);
            lVar8 = lVar8 + 0x48;
          }
        }
        DbaseCtrlBlk::get_next_trans(pDVar12,&buf,&numitem,&tid,&custid);
      }
      pEVar5 = this->args;
LAB_00108969:
      if ((pEVar5->use_newformat == '\0') && (pEVar5->use_seq != 0)) {
        uVar4 = local_218 & 0xffffffff;
        if ((int)local_218 < 1) {
          uVar4 = 0;
        }
        for (uVar9 = 0; uVar4 != uVar9; uVar9 = uVar9 + 1) {
          TransArray::setlastpos
                    ((this->extary).super__Vector_base<TransArray,_std::allocator<TransArray>_>.
                     _M_impl.super__Vector_impl_data._M_start +
                     (this->fidx).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar9]);
          (this->extary).super__Vector_base<TransArray,_std::allocator<TransArray>_>._M_impl.
          super__Vector_impl_data._M_start
          [(this->fidx).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start[uVar9]].theFlg = '\0';
        }
      }
    }
    lVar8 = 0;
    for (uVar4 = 0; uVar4 < this->numfreq; uVar4 = uVar4 + 1) {
      TransArray::flushbuf
                ((TransArray *)
                 ((long)&(((this->extary).
                           super__Vector_base<TransArray,_std::allocator<TransArray>_>._M_impl.
                           super__Vector_impl_data._M_start)->theArray).
                         super__Vector_base<int,_std::allocator<int>_>._M_impl + lVar8),__fd,
                 this->args->use_seq,pos);
      lVar8 = lVar8 + 0x48;
    }
    close(__fd);
    std::__cxx11::string::~string((string *)&tmpnam);
    pos = pos + 1;
  } while( true );
}

Assistant:

void Exttpose::do_invert_db(int pblk, int mincustid, int maxcustid) {
    int numitem = 0, tid = 0, custid = 0; // DD: to avoid gcc warning uninitialized var
    int *buf = nullptr; // DD: to avoid gcc warning uninitialized var
    ostringstream tmpname;
    int fd;
    int i, j, k, idx;

    dcb.get_first_blk();
    dcb.get_next_trans(buf, numitem, tid, custid);
    int ocid;// = -1;
    for (int p = 0; p < args.num_partitions; p++) {
        tmpname << args.output;

        if (args.num_partitions > 1) {
            tmpname << ".P" << p;
        }
        
        string tmpnam = tmpname.str();
        tmpname.str(string());

        if ((fd = open(tmpnam.c_str(), (O_WRONLY | O_CREAT | O_TRUNC | O_BINARY), 0666)) < 0) {
            throw runtime_error("Can't open out file");
        }

        for (i = 0; i < numfreq; i++) {
            extary[i].reset();
        }
        //count 2-itemsets
        int plb = p * pblk + mincustid;
        int pub = plb + pblk;
        if (pub >= maxcustid) pub = maxcustid + 1;
        env.logger << "BOUNDS " << plb << " " << pub << endl;
        int fcnt;
        for (; !dcb.eof() && custid < pub;) {
            fcnt = 0;
            ocid = custid;
            //env.logger << "TID " << custid << " " << tid << " " << numitem << endl;
            while (!dcb.eof() && ocid == custid && custid < pub) {
                //for (k=0; k < numitem; k++){

                // }

                if (args.use_diff) {
                    //add this tid to all items not in the trans
                    k = 0;
                    for (j = 0; j < numitem; j++) {
                        if (freqidx[buf[j]] == -1) continue;

                        while (backidx[k] < buf[j]) {
                            //if ((idx = freqidx[backidx[k]]) != -1){
                            idx = k;
                            if (!args.use_newformat)
                                extary[idx].add(fd, tid, args.use_seq, p);
                            else extary[idx].add(fd, tid, args.use_seq, p, custid);
                            //}
                            k++;
                        }
                        k++; //skip over buf[j]
                    }
                    for (; k < numfreq; k++) {
                        //if ((idx = freqidx[backidx[k]]) != -1){
                        idx = k;
                        if (!args.use_newformat)
                            extary[idx].add(fd, tid, args.use_seq, p);
                        else extary[idx].add(fd, tid, args.use_seq, p, custid);
                        //}
                    }
                } else {
                    // add this tid to all items in the trans
                    for (j = 0; j < numitem; j++) {
                        idx = freqidx[buf[j]];
                        if (idx != -1) {
                            if (!args.use_newformat) {
                                if (args.use_seq && extary[idx].flg() == 0) {
                                    fidx[fcnt] = idx;
                                    fcnt++;
                                    extary[idx].setflg(1);
                                    extary[idx].add(fd, tid, args.use_seq, p, custid);
                                } else {
                                    extary[idx].add(fd, tid, args.use_seq, p);
                                }
                            } else {
                                extary[idx].add(fd, tid, args.use_seq, p, custid);
                            }
                        }
                    }
                }

                dcb.get_next_trans(buf, numitem, tid, custid);
            }
            if (!args.use_newformat && args.use_seq) {
                for (k = 0; k < fcnt; k++) {
                    extary[fidx[k]].setlastpos();
                    extary[fidx[k]].setflg(0);
                }
                fcnt = 0;
            }
        }

        for (i = 0; i < numfreq; i++) {
            //env.logger << "FLUSH " << i << " " << extary[i].lastPos << " " <<
            //   extary[i].theSize << endl;
            extary[i].flushbuf(fd, args.use_seq, p);
        }
        close(fd);
    }
    env.logger << "WROTE INVERT " << endl;
}